

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O3

void MatchFinder_CheckLimits(CMatchFinder *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_t sVar3;
  CLzRef *pCVar4;
  uint uVar5;
  uint uVar6;
  UInt32 UVar7;
  uint uVar8;
  UInt32 lenLimit;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  CLzRef CVar12;
  
  UVar7 = p->pos;
  if (UVar7 == 0xffffffff) {
    uVar5 = -p->historySize - 2 & 0xfffffc00;
    sVar3 = p->numRefs;
    if (sVar3 == 0) {
      UVar7 = 0xffffffff;
    }
    else {
      pCVar4 = p->hash;
      sVar11 = 0;
      do {
        uVar6 = pCVar4[sVar11];
        CVar12 = uVar6 - uVar5;
        if (uVar6 < uVar5) {
          CVar12 = 0;
        }
        pCVar4[sVar11] = CVar12;
        sVar11 = sVar11 + 1;
      } while (sVar3 != sVar11);
      UVar7 = p->pos;
    }
    UVar7 = UVar7 - uVar5;
    p->pos = UVar7;
    uVar1 = p->posLimit;
    uVar2 = p->streamPos;
    p->posLimit = uVar1 - uVar5;
    p->streamPos = uVar2 - uVar5;
  }
  if ((p->streamEndWasReached == '\0') && (uVar5 = p->keepSizeAfter, uVar5 == p->streamPos - UVar7))
  {
    if (p->directInput == '\0') {
      if (p->bufferBase + ((ulong)p->blockSize - (long)p->buffer) <= (Byte *)(ulong)uVar5) {
        memmove(p->bufferBase,p->buffer + -(ulong)p->keepSizeBefore,
                (size_t)((Byte *)(ulong)uVar5 + p->keepSizeBefore));
        p->buffer = p->bufferBase + p->keepSizeBefore;
      }
    }
    MatchFinder_ReadBlock(p);
  }
  UVar7 = p->cyclicBufferPos;
  if (UVar7 == p->cyclicBufferSize) {
    p->cyclicBufferPos = 0;
    UVar7 = 0;
  }
  uVar5 = p->pos;
  uVar6 = p->cyclicBufferSize - UVar7;
  if (~uVar5 <= uVar6) {
    uVar6 = ~uVar5;
  }
  uVar9 = p->streamPos - uVar5;
  uVar10 = uVar9 - p->keepSizeAfter;
  uVar8 = (uint)(uVar9 != 0);
  if (p->keepSizeAfter <= uVar9 && uVar10 != 0) {
    uVar8 = uVar10;
  }
  if (uVar6 <= uVar8) {
    uVar8 = uVar6;
  }
  if (p->matchMaxLen <= uVar9) {
    uVar9 = p->matchMaxLen;
  }
  p->lenLimit = uVar9;
  p->posLimit = uVar8 + uVar5;
  return;
}

Assistant:

static void MatchFinder_CheckLimits(CMatchFinder *p)
{
  if (p->pos == kMaxValForNormalize)
    MatchFinder_Normalize(p);
  if (!p->streamEndWasReached && p->keepSizeAfter == p->streamPos - p->pos)
    MatchFinder_CheckAndMoveAndRead(p);
  if (p->cyclicBufferPos == p->cyclicBufferSize)
    p->cyclicBufferPos = 0;
  MatchFinder_SetLimits(p);
}